

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O0

REF_STATUS
ref_cavity_find_seg(REF_CAVITY ref_cavity,REF_INT *nodes,REF_INT *found_seg,REF_BOOL *reversed)

{
  int local_34;
  REF_INT seg;
  REF_BOOL *reversed_local;
  REF_INT *found_seg_local;
  REF_INT *nodes_local;
  REF_CAVITY ref_cavity_local;
  
  *found_seg = -1;
  local_34 = 0;
  do {
    if (ref_cavity->maxseg <= local_34) {
      return 5;
    }
    if (((-1 < local_34) && (local_34 < ref_cavity->maxseg)) &&
       (ref_cavity->s2n[local_34 * 3] != -1)) {
      if ((*nodes == ref_cavity->s2n[local_34 * 3]) &&
         (nodes[1] == ref_cavity->s2n[local_34 * 3 + 1])) {
        *found_seg = local_34;
        *reversed = 0;
        return 0;
      }
      if ((nodes[1] == ref_cavity->s2n[local_34 * 3]) &&
         (*nodes == ref_cavity->s2n[local_34 * 3 + 1])) {
        *found_seg = local_34;
        *reversed = 1;
        return 0;
      }
    }
    local_34 = local_34 + 1;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_cavity_find_seg(REF_CAVITY ref_cavity, REF_INT *nodes,
                                       REF_INT *found_seg, REF_BOOL *reversed) {
  REF_INT seg;

  *found_seg = REF_EMPTY;

  each_ref_cavity_valid_seg(ref_cavity, seg) {
    if ((nodes[0] == ref_cavity_s2n(ref_cavity, 0, seg) &&
         nodes[1] == ref_cavity_s2n(ref_cavity, 1, seg))) {
      *found_seg = seg;
      *reversed = REF_FALSE;
      return REF_SUCCESS;
    }
    if ((nodes[1] == ref_cavity_s2n(ref_cavity, 0, seg) &&
         nodes[0] == ref_cavity_s2n(ref_cavity, 1, seg))) {
      *found_seg = seg;
      *reversed = REF_TRUE;
      return REF_SUCCESS;
    }
  }

  return REF_NOT_FOUND;
}